

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeNVE.cpp
# Opt level: O0

void __thiscall OpenMD::FluctuatingChargeNVE::PositionStep(FluctuatingChargeNVE *this,RealType dt)

{
  Molecule *i_00;
  Atom *this_00;
  long in_RDI;
  double in_XMM0_Qa;
  RealType charge;
  RealType RVar1;
  RealType cpos;
  RealType cvel;
  Atom *atom;
  Molecule *mol;
  FluctuatingChargeIterator j;
  MoleculeIterator i;
  StuntDouble *in_stack_ffffffffffffffc0;
  MoleculeIterator *in_stack_ffffffffffffffd8;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  in_stack_ffffffffffffffe0;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_18;
  double local_10;
  
  if ((*(byte *)(in_RDI + 0x28) & 1) != 0) {
    local_10 = in_XMM0_Qa;
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_18);
    __gnu_cxx::
    __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
    ::__normal_iterator((__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                         *)&stack0xffffffffffffffe0);
    for (i_00 = SimInfo::beginMolecule
                          ((SimInfo *)in_stack_ffffffffffffffe0._M_current,in_stack_ffffffffffffffd8
                          ); i_00 != (Molecule *)0x0;
        i_00 = SimInfo::nextMolecule
                         ((SimInfo *)in_stack_ffffffffffffffe0._M_current,(MoleculeIterator *)i_00))
    {
      this_00 = Molecule::beginFluctuatingCharge
                          ((Molecule *)in_stack_ffffffffffffffe0._M_current,(iterator *)i_00);
      while (this_00 != (Atom *)0x0) {
        charge = StuntDouble::getFlucQVel(in_stack_ffffffffffffffc0);
        RVar1 = StuntDouble::getFlucQPos(in_stack_ffffffffffffffc0);
        in_stack_ffffffffffffffc0 = (StuntDouble *)(local_10 * charge + RVar1);
        StuntDouble::setFlucQPos(&this_00->super_StuntDouble,charge);
        this_00 = Molecule::nextFluctuatingCharge
                            ((Molecule *)in_stack_ffffffffffffffe0._M_current,(iterator *)i_00);
      }
    }
  }
  return;
}

Assistant:

void FluctuatingChargeNVE::PositionStep(RealType dt) {
    if (!hasFlucQ_) return;

    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;
    RealType cvel, cpos;

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
           atom = mol->nextFluctuatingCharge(j)) {
        cvel = atom->getFlucQVel();
        cpos = atom->getFlucQPos();

        cpos += dt * cvel;
        atom->setFlucQPos(cpos);
      }
    }
  }